

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

_Bool al_save_sample(char *filename,ALLEGRO_SAMPLE *spl)

{
  char *pcVar1;
  ulong uVar2;
  ACODEC_TABLE *pAVar3;
  ALLEGRO_SAMPLE *in_RSI;
  char *in_RDI;
  ACODEC_TABLE *ent;
  char *ext;
  _Bool local_1;
  
  pcVar1 = strrchr(in_RDI,0x2e);
  if (pcVar1 == (char *)0x0) {
    uVar2 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x166,"al_save_sample");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("Unable to determine extension for %s.\n",in_RDI);
    }
    local_1 = false;
  }
  else {
    pAVar3 = find_acodec_table_entry((char *)in_RSI);
    if ((pAVar3 == (ACODEC_TABLE *)0x0) ||
       (pAVar3->saver == (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) {
      uVar2 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                               ,0x16f,"al_save_sample");
      if ((uVar2 & 1) != 0) {
        _al_trace_suffix("No handler for audio file extension %s - therefore not trying to load %s.\n"
                         ,pcVar1,in_RDI);
      }
      local_1 = false;
    }
    else {
      local_1 = (*pAVar3->saver)(in_RDI,in_RSI);
    }
  }
  return local_1;
}

Assistant:

bool al_save_sample(const char *filename, ALLEGRO_SAMPLE *spl)
{
   const char *ext;
   ACODEC_TABLE *ent;

   ASSERT(filename);
   ext = strrchr(filename, '.');
   if (ext == NULL) {
      ALLEGRO_ERROR("Unable to determine extension for %s.\n", filename);
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (ent && ent->saver) {
      return (ent->saver)(filename, spl);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s - "
         "therefore not trying to load %s.\n", ext, filename);
   }

   return false;
}